

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int do_floor(vorb *f,Mapping *map,int i,int n,float *target,YTYPE *finalY,uint8 *step2_flag)

{
  Floor *pFVar1;
  int n_00;
  uint uVar2;
  uint uVar3;
  int y1;
  uint x1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  vorb *in_RDI;
  float *in_R8;
  short *in_R9;
  int hx;
  int hy;
  int ly;
  int lx;
  int q;
  int j;
  Floor1 *g;
  int floor;
  int s;
  int n2;
  int local_58;
  uint local_54;
  int local_50;
  uint local_4c;
  int local_4;
  
  n_00 = in_ECX >> 1;
  uVar2 = (uint)*(byte *)(in_RSI + 0x11 +
                         (long)(int)(uint)*(byte *)(*(long *)(in_RSI + 8) + (long)in_EDX * 3 + 2));
  if (in_RDI->floor_types[(int)uVar2] == 0) {
    local_4 = error(in_RDI,VORBIS_invalid_stream);
  }
  else {
    pFVar1 = in_RDI->floor_config;
    local_54 = 0;
    local_58 = (int)*in_R9 * (uint)(&pFVar1->floor1)[(int)uVar2].floor1_multiplier;
    for (local_50 = 1; local_50 < (&pFVar1->floor1)[(int)uVar2].values; local_50 = local_50 + 1) {
      uVar3 = (uint)*(byte *)((long)pFVar1 + (long)local_50 + (long)(int)uVar2 * 0x63c + 0x346);
      y1 = local_58;
      x1 = local_54;
      if (-1 < in_R9[(int)uVar3]) {
        y1 = (int)in_R9[(int)uVar3] * (uint)(&pFVar1->floor1)[(int)uVar2].floor1_multiplier;
        x1 = (uint)*(ushort *)
                    ((long)pFVar1 + (long)(int)uVar3 * 2 + (long)(int)uVar2 * 0x63c + 0x152);
        if (local_54 != x1) {
          draw_line(in_R8,local_54,local_58,x1,y1,n_00);
        }
      }
      local_54 = x1;
      local_58 = y1;
    }
    if ((int)local_54 < n_00) {
      for (local_4c = local_54; (int)local_4c < n_00; local_4c = local_4c + 1) {
        in_R8[(int)local_4c] = inverse_db_table[local_58] * in_R8[(int)local_4c];
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int do_floor(vorb *f, Mapping *map, int i, int n, float *target, YTYPE *finalY, uint8 *step2_flag)
{
   int n2 = n >> 1;
   int s = map->chan[i].mux, floor;
   floor = map->submap_floor[s];
   if (f->floor_types[floor] == 0) {
      return error(f, VORBIS_invalid_stream);
   } else {
      Floor1 *g = &f->floor_config[floor].floor1;
      int j,q;
      int lx = 0, ly = finalY[0] * g->floor1_multiplier;
      for (q=1; q < g->values; ++q) {
         j = g->sorted_order[q];
         #ifndef STB_VORBIS_NO_DEFER_FLOOR
         STBV_NOTUSED(step2_flag);
         if (finalY[j] >= 0)
         #else
         if (step2_flag[j])
         #endif
         {
            int hy = finalY[j] * g->floor1_multiplier;
            int hx = g->Xlist[j];
            if (lx != hx)
               draw_line(target, lx,ly, hx,hy, n2);
            CHECK(f);
            lx = hx, ly = hy;
         }
      }
      if (lx < n2) {
         // optimization of: draw_line(target, lx,ly, n,ly, n2);
         for (j=lx; j < n2; ++j)
            LINE_OP(target[j], inverse_db_table[ly]);
         CHECK(f);
      }
   }
   return TRUE;
}